

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

OperationId __thiscall
de::Random::
chooseWeighted<deqp::egl::OperationId,__gnu_cxx::__normal_iterator<deqp::egl::OperationId*,std::vector<deqp::egl::OperationId,std::allocator<deqp::egl::OperationId>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
          (Random *this,
          __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
          first,__normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
                last,__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> weight)

{
  OperationId *pOVar1;
  int iVar2;
  __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
  _Var3;
  OperationId *pOVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = 0.0;
  for (iVar2 = 0; first._M_current + iVar2 != last._M_current; iVar2 = iVar2 + 1) {
    fVar5 = fVar5 + weight._M_current[iVar2];
  }
  fVar6 = deRandom_getFloat(&this->m_rnd);
  iVar2 = 0;
  fVar7 = 0.0;
  _Var3._M_current = last._M_current;
  while( true ) {
    pOVar1 = first._M_current + iVar2;
    pOVar4 = _Var3._M_current;
    if (pOVar1 == last._M_current) break;
    fVar7 = fVar7 + weight._M_current[iVar2];
    pOVar4 = pOVar1;
    if (fVar5 * fVar6 + 0.0 < fVar7) break;
    if (0.0 < weight._M_current[iVar2]) {
      _Var3._M_current = pOVar1;
    }
    iVar2 = iVar2 + 1;
  }
  return *pOVar4;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}